

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

int __thiscall
tchecker::assign_statement_t::clone
          (assign_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  element_type *peVar2;
  lvalue_expression_t *__p;
  element_type *peVar3;
  undefined4 extraout_var;
  assign_statement_t *this_00;
  undefined1 local_30 [8];
  shared_ptr<const_tchecker::expression_t> rvalue_clone;
  shared_ptr<const_tchecker::lvalue_expression_t> lvalue_clone;
  assign_statement_t *this_local;
  
  peVar2 = std::
           __shared_ptr_access<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_lvalue);
  __p = (lvalue_expression_t *)(**(code **)((long)*peVar2 + 0x28))();
  std::shared_ptr<tchecker::lvalue_expression_t_const>::
  shared_ptr<tchecker::lvalue_expression_t,void>
            ((shared_ptr<tchecker::lvalue_expression_t_const> *)
             &rvalue_clone.
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  peVar3 = std::
           __shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_rvalue);
  iVar1 = (*peVar3->_vptr_expression_t[2])();
  std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::expression_t,void>
            ((shared_ptr<tchecker::expression_t_const> *)local_30,
             (expression_t *)CONCAT44(extraout_var,iVar1));
  this_00 = (assign_statement_t *)operator_new(0x28);
  assign_statement_t(this_00,(shared_ptr<const_tchecker::lvalue_expression_t> *)
                             &rvalue_clone.
                              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,(shared_ptr<const_tchecker::expression_t> *)local_30);
  std::shared_ptr<const_tchecker::expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::expression_t> *)local_30);
  std::shared_ptr<const_tchecker::lvalue_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::lvalue_expression_t> *)
             &rvalue_clone.
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::assign_statement_t * assign_statement_t::clone() const
{
  std::shared_ptr<tchecker::lvalue_expression_t const> lvalue_clone{_lvalue->clone()};
  std::shared_ptr<tchecker::expression_t const> rvalue_clone{_rvalue->clone()};
  return new tchecker::assign_statement_t(lvalue_clone, rvalue_clone);
}